

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igami.c
# Opt level: O1

double hcephes_igami(double a,double y0)

{
  double dVar1;
  int iVar2;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_88;
  double local_68;
  double local_58;
  double local_48;
  int iVar3;
  
  dVar8 = 1.0 / (a * 9.0);
  local_68 = 1.0;
  dVar6 = hcephes_ndtri(y0);
  local_48 = 0.0;
  if (dVar8 < 0.0) {
    dVar7 = sqrt(dVar8);
  }
  else {
    dVar7 = SQRT(dVar8);
  }
  dVar8 = (1.0 - dVar8) - dVar6 * dVar7;
  dVar8 = dVar8 * a * dVar8 * dVar8;
  dVar6 = hcephes_lgam(a);
  if (0.0 <= dVar8) {
    local_58 = 0.0;
    local_68 = 1.0;
    local_88 = INFINITY;
    uVar4 = 0;
    local_48 = 0.0;
    while ((dVar7 = hcephes_igamc(a,dVar8), local_58 <= dVar7 && (dVar7 <= local_68))) {
      dVar9 = dVar8;
      dVar1 = dVar7;
      if (y0 <= dVar7) {
        dVar9 = local_88;
        local_68 = dVar7;
        dVar1 = local_58;
      }
      local_58 = dVar1;
      local_88 = dVar9;
      local_48 = (double)((ulong)local_48 & -(ulong)(dVar7 < y0) |
                         ~-(ulong)(dVar7 < y0) & (ulong)dVar8);
      dVar9 = log(dVar8);
      dVar9 = (dVar9 * (a + -1.0) - dVar8) - dVar6;
      if (dVar9 < -709.782712893384) break;
      dVar9 = exp(dVar9);
      dVar7 = (dVar7 - y0) / -dVar9;
      if (ABS(dVar7 / dVar8) < 1.1102230246251565e-16) {
        return dVar8;
      }
      dVar8 = dVar8 - dVar7;
      if (((8 < uVar4) || (local_88 < dVar8)) || (uVar4 = uVar4 + 1, dVar8 < local_48)) break;
    }
  }
  else {
    local_88 = INFINITY;
    local_58 = 0.0;
  }
  if (INFINITY <= local_88) {
    local_88 = (double)(~-(ulong)(0.0 < dVar8) & 0x3ff1000000000000 |
                       (ulong)(dVar8 * 1.0625) & -(ulong)(0.0 < dVar8));
    local_58 = hcephes_igamc(a,local_88);
    if (y0 <= local_58) {
      dVar6 = 0.0625;
      do {
        dVar6 = dVar6 + dVar6;
        local_88 = local_88 * (dVar6 + 1.0);
        local_58 = hcephes_igamc(a,local_88);
      } while (y0 <= local_58);
    }
  }
  iVar2 = 0;
  iVar5 = 400;
  dVar6 = 0.5;
  do {
    dVar7 = dVar6 * (local_88 - local_48) + local_48;
    dVar8 = hcephes_igamc(a,dVar7);
    if (((ABS((local_88 - local_48) / (local_48 + local_88)) < 5.551115123125783e-16) ||
        (dVar7 <= 0.0)) || (ABS((dVar8 - y0) / y0) < 5.551115123125783e-16)) break;
    if (y0 <= dVar8) {
      if (iVar2 < 0) {
        iVar2 = 0;
        dVar9 = 0.5;
      }
      else if (iVar2 < 2) {
        dVar9 = (y0 - local_58) / (dVar8 - local_58);
      }
      else {
        dVar9 = dVar6 * 0.5 + 0.5;
      }
      iVar2 = iVar2 + 1;
      local_68 = dVar8;
      local_48 = dVar7;
    }
    else {
      dVar9 = 0.5;
      iVar3 = 0;
      if (iVar2 < 1) {
        iVar3 = iVar2;
        if (iVar2 < -1) {
          dVar9 = dVar6 * 0.5;
        }
        else {
          dVar9 = (y0 - dVar8) / (local_68 - dVar8);
        }
      }
      iVar2 = iVar3 + -1;
      local_88 = dVar7;
      local_58 = dVar8;
    }
    iVar5 = iVar5 + -1;
    dVar6 = dVar9;
  } while (iVar5 != 0);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    hcephes_mtherr("igami",4);
  }
  return dVar7;
}

Assistant:

HCEPHES_API double hcephes_igami(double a, double y0) {
    double x0, x1, x, yl, yh, y, d, lgm, dithresh;
    int i, dir;

    /* bound the solution */
    x0 = HUGE_VAL;
    yl = 0;
    x1 = 0;
    yh = 1.0;
    dithresh = 5.0 * HCEPHES_MACHEP;

    /* approximation to inverse function */
    d = 1.0 / (9.0 * a);
    y = (1.0 - d - hcephes_ndtri(y0) * sqrt(d));
    x = a * y * y * y;

    lgm = hcephes_lgam(a);

    for (i = 0; i < 10; i++) {
        if (x > x0 || x < x1)
            goto ihalve;
        y = hcephes_igamc(a, x);
        if (y < yl || y > yh)
            goto ihalve;
        if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        /* compute the derivative of the function at this point */
        d = (a - 1.0) * log(x) - x - lgm;
        if (d < -HCEPHES_MAXLOG)
            goto ihalve;
        d = -exp(d);
        /* compute the step to the next approximation of x */
        d = (y - y0) / d;
        if (fabs(d / x) < HCEPHES_MACHEP)
            goto done;
        x = x - d;
    }

/* Resort to interval halving if Newton iteration did not converge. */
ihalve:

    d = 0.0625;
    if (x0 == HUGE_VAL) {
        if (x <= 0.0)
            x = 1.0;
        while (x0 == HUGE_VAL) {
            x = (1.0 + d) * x;
            y = hcephes_igamc(a, x);
            if (y < y0) {
                x0 = x;
                yl = y;
                break;
            }
            d = d + d;
        }
    }
    d = 0.5;
    dir = 0;

    for (i = 0; i < 400; i++) {
        x = x1 + d * (x0 - x1);
        y = hcephes_igamc(a, x);
        lgm = (x0 - x1) / (x1 + x0);
        if (fabs(lgm) < dithresh)
            break;
        lgm = (y - y0) / y0;
        if (fabs(lgm) < dithresh)
            break;
        if (x <= 0.0)
            break;
        if (y >= y0) {
            x1 = x;
            yh = y;
            if (dir < 0) {
                dir = 0;
                d = 0.5;
            } else if (dir > 1)
                d = 0.5 * d + 0.5;
            else
                d = (y0 - yl) / (yh - yl);
            dir += 1;
        } else {
            x0 = x;
            yl = y;
            if (dir > 0) {
                dir = 0;
                d = 0.5;
            } else if (dir < -1)
                d = 0.5 * d;
            else
                d = (y0 - yl) / (yh - yl);
            dir -= 1;
        }
    }
    if (x == 0.0)
        hcephes_mtherr("igami", HCEPHES_UNDERFLOW);

done:
    return (x);
}